

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  bool bVar1;
  void *local_60;
  ImVec4 *local_58;
  undefined1 local_48 [8];
  ImDrawCmd draw_cmd;
  ImDrawList *this_local;
  
  draw_cmd.UserCallbackData = this;
  ImDrawCmd::ImDrawCmd((ImDrawCmd *)local_48);
  if ((this->_ClipRectStack).Size == 0) {
    local_58 = &this->_Data->ClipRectFullscreen;
  }
  else {
    local_58 = (this->_ClipRectStack).Data + ((this->_ClipRectStack).Size + -1);
  }
  local_48._4_4_ = local_58->x;
  unique0x00012004 = local_58->y;
  draw_cmd.ClipRect.x = local_58->z;
  draw_cmd.ClipRect.y = local_58->w;
  if ((this->_TextureIdStack).Size == 0) {
    local_60 = (void *)0x0;
  }
  else {
    local_60 = (this->_TextureIdStack).Data[(this->_TextureIdStack).Size + -1];
  }
  draw_cmd._16_8_ = local_60;
  draw_cmd.TextureId._0_4_ = this->_VtxCurrentOffset;
  draw_cmd.TextureId._4_4_ = (this->IdxBuffer).Size;
  bVar1 = false;
  if (local_48._4_4_ <= draw_cmd.ClipRect.x) {
    bVar1 = unique0x00012004 <= draw_cmd.ClipRect.y;
  }
  if (!bVar1) {
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                  ,0x19e,"void ImDrawList::AddDrawCmd()");
  }
  ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,(ImDrawCmd *)local_48);
  return;
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = GetCurrentClipRect();
    draw_cmd.TextureId = GetCurrentTextureId();
    draw_cmd.VtxOffset = _VtxCurrentOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}